

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOBindingNegativeCase::generateShaders
          (SSBOBindingNegativeCase *this)

{
  ShaderType SVar1;
  ostream *poVar2;
  ShaderProgram *this_00;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  int declNdx;
  ulong uVar7;
  string uname;
  ProgramSources sources;
  ostringstream shaderBody;
  ostringstream tessEvalUniformDecl;
  ostringstream tessCtrlUniformDecl;
  ostringstream fragmentUniformDecl;
  ostringstream vertexUniformDecl;
  undefined4 local_c38;
  undefined4 uStack_c34;
  value_type local_c30;
  string *local_c10;
  uint local_c04;
  string local_c00;
  string local_be0;
  string local_bc0;
  string local_ba0;
  string local_b80;
  string local_b60;
  undefined1 local_b40 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b30;
  undefined1 local_b18 [16];
  undefined1 local_b08 [128];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_a88;
  deUint32 local_a70;
  undefined1 local_a68 [24];
  undefined1 uStack_a50;
  string local_a48;
  string local_a28;
  string local_a08;
  string local_9e8;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  ulong local_948;
  string local_940;
  string local_920;
  undefined1 local_900 [96];
  undefined1 auStack_8a0 [48];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_870;
  deUint32 local_858;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_850;
  bool local_838;
  ostringstream local_788 [112];
  ios_base local_718 [264];
  ostringstream local_610 [112];
  ios_base local_5a0 [264];
  ostringstream local_498 [112];
  ios_base local_428 [264];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__cxx11::ostringstream::ostringstream(local_498);
  std::__cxx11::ostringstream::ostringstream(local_610);
  std::__cxx11::ostringstream::ostringstream(local_788);
  uVar3 = (this->super_LayoutBindingNegativeCase).m_testType - TESTTYPE_BINDING_ARRAY;
  uVar4 = 1;
  if (1 < uVar3) {
    uVar4 = (this->super_LayoutBindingNegativeCase).m_numBindings;
  }
  if (0 < (int)uVar4) {
    local_c10 = &(this->super_LayoutBindingNegativeCase).m_uniformName;
    local_948 = (ulong)uVar4;
    uVar7 = 0;
    local_c04 = uVar3;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(std140, binding = ",0x19);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (local_1a8,
                          (this->super_LayoutBindingNegativeCase).m_vertexShaderBinding.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") buffer ",9);
      declNdx = (int)uVar7;
      getUniformName((string *)local_900,local_c10,declNdx);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)local_900._0_8_,local_900._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\thighp vec4 color1;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\thighp vec4 color2;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} ",2);
      if (uVar3 < 2) {
        local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_968,"colors","");
        getUniformName((string *)local_b18,&local_968,declNdx,
                       (this->super_LayoutBindingNegativeCase).m_numBindings);
        uVar3 = local_c04;
      }
      else {
        local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_988,"colors","");
        getUniformName((string *)local_b18,&local_988,declNdx);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)CONCAT44(local_b18._4_4_,local_b18._0_4_),local_b18._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      if ((undefined1 *)CONCAT44(local_b18._4_4_,local_b18._0_4_) != local_b08) {
        operator_delete((undefined1 *)CONCAT44(local_b18._4_4_,local_b18._0_4_),local_b08._0_8_ + 1)
        ;
      }
      if (uVar3 < 2) {
LAB_0042914a:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_968._M_dataplus._M_p != &local_968.field_2) {
          operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_988._M_dataplus._M_p != &local_988.field_2) {
          operator_delete(local_988._M_dataplus._M_p,local_988.field_2._M_allocated_capacity + 1);
        }
        if (uVar3 < 2) goto LAB_0042914a;
      }
      if ((undefined1 *)local_900._0_8_ != local_900 + 0x10) {
        operator_delete((void *)local_900._0_8_,local_900._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"layout(std140, binding = ",0x19);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (local_320,
                          (this->super_LayoutBindingNegativeCase).m_fragmentShaderBinding.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") buffer ",9);
      getUniformName((string *)local_900,local_c10,declNdx);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)local_900._0_8_,local_900._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\thighp vec4 color1;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\thighp vec4 color2;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} ",2);
      if (uVar3 < 2) {
        local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a8,"colors","");
        getUniformName((string *)local_b18,&local_9a8,declNdx,
                       (this->super_LayoutBindingNegativeCase).m_numBindings);
      }
      else {
        local_9c8._M_dataplus._M_p = (pointer)&local_9c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c8,"colors","");
        getUniformName((string *)local_b18,&local_9c8,declNdx);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)CONCAT44(local_b18._4_4_,local_b18._0_4_),local_b18._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      if ((undefined1 *)CONCAT44(local_b18._4_4_,local_b18._0_4_) != local_b08) {
        operator_delete((undefined1 *)CONCAT44(local_b18._4_4_,local_b18._0_4_),local_b08._0_8_ + 1)
        ;
      }
      if (uVar3 < 2) {
LAB_00429390:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
          operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
          operator_delete(local_9c8._M_dataplus._M_p,local_9c8.field_2._M_allocated_capacity + 1);
        }
        if (uVar3 < 2) goto LAB_00429390;
      }
      if ((undefined1 *)local_900._0_8_ != local_900 + 0x10) {
        operator_delete((void *)local_900._0_8_,local_900._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_498,"layout(std140, binding = ",0x19);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (local_498,
                          (this->super_LayoutBindingNegativeCase).m_tessCtrlShaderBinding.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") buffer ",9);
      getUniformName((string *)local_900,local_c10,declNdx);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)local_900._0_8_,local_900._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\thighp vec4 color1;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\thighp vec4 color2;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} ",2);
      if (uVar3 < 2) {
        local_9e8._M_dataplus._M_p = (pointer)&local_9e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e8,"colors","");
        getUniformName((string *)local_b18,&local_9e8,declNdx,
                       (this->super_LayoutBindingNegativeCase).m_numBindings);
      }
      else {
        local_a08._M_dataplus._M_p = (pointer)&local_a08.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a08,"colors","");
        getUniformName((string *)local_b18,&local_a08,declNdx);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)CONCAT44(local_b18._4_4_,local_b18._0_4_),local_b18._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      if ((undefined1 *)CONCAT44(local_b18._4_4_,local_b18._0_4_) != local_b08) {
        operator_delete((undefined1 *)CONCAT44(local_b18._4_4_,local_b18._0_4_),local_b08._0_8_ + 1)
        ;
      }
      if (uVar3 < 2) {
LAB_004295d6:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9e8._M_dataplus._M_p != &local_9e8.field_2) {
          operator_delete(local_9e8._M_dataplus._M_p,local_9e8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
          operator_delete(local_a08._M_dataplus._M_p,local_a08.field_2._M_allocated_capacity + 1);
        }
        if (uVar3 < 2) goto LAB_004295d6;
      }
      if ((undefined1 *)local_900._0_8_ != local_900 + 0x10) {
        operator_delete((void *)local_900._0_8_,local_900._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_610,"layout(std140, binding = ",0x19);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (local_610,
                          (this->super_LayoutBindingNegativeCase).m_tessEvalShaderBinding.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") buffer ",9);
      getUniformName((string *)local_900,local_c10,declNdx);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)local_900._0_8_,local_900._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\thighp vec4 color1;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\thighp vec4 color2;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} ",2);
      if (uVar3 < 2) {
        local_b60._M_dataplus._M_p = (pointer)&local_b60.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b60,"colors","");
        getUniformName((string *)local_b18,&local_b60,declNdx,
                       (this->super_LayoutBindingNegativeCase).m_numBindings);
      }
      else {
        local_a28._M_dataplus._M_p = (pointer)&local_a28.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a28,"colors","");
        getUniformName((string *)local_b18,&local_a28,declNdx);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)CONCAT44(local_b18._4_4_,local_b18._0_4_),local_b18._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      if ((undefined1 *)CONCAT44(local_b18._4_4_,local_b18._0_4_) != local_b08) {
        operator_delete((undefined1 *)CONCAT44(local_b18._4_4_,local_b18._0_4_),local_b08._0_8_ + 1)
        ;
      }
      if (uVar3 < 2) {
LAB_0042980c:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b60._M_dataplus._M_p != &local_b60.field_2) {
          operator_delete(local_b60._M_dataplus._M_p,local_b60.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a28._M_dataplus._M_p != &local_a28.field_2) {
          operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
        }
        if (uVar3 < 2) goto LAB_0042980c;
      }
      if ((undefined1 *)local_900._0_8_ != local_900 + 0x10) {
        operator_delete((void *)local_900._0_8_,local_900._16_8_ + 1);
      }
      uVar7 = uVar7 + 1;
    } while (local_948 != uVar7);
  }
  if (0 < (this->super_LayoutBindingNegativeCase).m_numBindings * 2) {
    uVar4 = 0;
    do {
      if (uVar3 < 2) {
        local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_940,"colors","");
        getUniformName((string *)local_b18,&local_940,0,uVar4 >> 1);
LAB_0042994d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_940._M_dataplus._M_p != &local_940.field_2) {
          operator_delete(local_940._M_dataplus._M_p,local_940.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_a48._M_dataplus._M_p = (pointer)&local_a48.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a48,"colors","");
        getUniformName((string *)local_b18,&local_a48,uVar4 >> 1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a48._M_dataplus._M_p != &local_a48.field_2) {
          operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
        }
        if (uVar3 < 2) goto LAB_0042994d;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"\t",1);
      pcVar5 = "else if";
      if (uVar4 == 0) {
        pcVar5 = "if";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_788,pcVar5,(ulong)(uVar4 != 0) * 5 + 2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_788," (u_arrayNdx == ",0x10);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_900);
      std::ostream::operator<<((ostringstream *)local_900,uVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_900);
      std::ios_base::~ios_base((ios_base *)(auStack_8a0 + 0x10));
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_788,(char *)CONCAT44(uStack_c34,local_c38),
                          (long)local_c30._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t{\n",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t\tcolor = ",10);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)CONCAT44(local_b18._4_4_,local_b18._0_4_),local_b18._8_8_);
      pcVar5 = ".color2";
      if ((uVar4 & 1) == 0) {
        pcVar5 = ".color1";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t}\n",3);
      if ((size_type *)CONCAT44(uStack_c34,local_c38) != &local_c30._M_string_length) {
        operator_delete((undefined1 *)CONCAT44(uStack_c34,local_c38),local_c30._M_string_length + 1)
        ;
      }
      if ((undefined1 *)CONCAT44(local_b18._4_4_,local_b18._0_4_) != local_b08) {
        operator_delete((undefined1 *)CONCAT44(local_b18._4_4_,local_b18._0_4_),local_b08._0_8_ + 1)
        ;
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < (this->super_LayoutBindingNegativeCase).m_numBindings * 2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"\telse\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_788,"\t\tcolor = vec4(0.0, 0.0, 0.0, 1.0);\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"\t}\n",3);
  local_a68[0x10] = 0;
  stack0xfffffffffffff5a9 = 0;
  local_a68._0_8_ = (pointer)0x0;
  local_a68[8] = 0;
  local_a68._9_7_ = 0;
  memset(local_b18,0,0xac);
  SVar1 = (this->super_LayoutBindingNegativeCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateVertexShader(&local_be0,SVar1,&local_bc0,&local_ba0);
  local_c30._M_dataplus._M_p = (pointer)&local_c30.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c30,local_be0._M_dataplus._M_p,
             local_be0._M_dataplus._M_p + local_be0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b18,&local_c30);
  SVar1 = (this->super_LayoutBindingNegativeCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateFragmentShader(&local_c00,SVar1,&local_b80,&local_920);
  local_b40._0_4_ = 1;
  local_b40._8_8_ = local_b30._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_b40 + 8),local_c00._M_dataplus._M_p,
             local_c00._M_dataplus._M_p + local_c00._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_b18 + (ulong)(uint)local_b40._0_4_ * 0x18),(value_type *)(local_b40 + 8));
  lVar6 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_900 + lVar6),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_b18 + lVar6));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&local_870,&local_a88);
  local_858 = local_a70;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_850,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a68);
  local_838 = (bool)uStack_a50;
  if ((char *)local_b40._8_8_ != local_b30._M_local_buf + 8) {
    operator_delete((void *)local_b40._8_8_,local_b30._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c00._M_dataplus._M_p != &local_c00.field_2) {
    operator_delete(local_c00._M_dataplus._M_p,local_c00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920._M_dataplus._M_p != &local_920.field_2) {
    operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
    operator_delete(local_b80._M_dataplus._M_p,local_b80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
    operator_delete(local_c30._M_dataplus._M_p,local_c30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be0._M_dataplus._M_p != &local_be0.field_2) {
    operator_delete(local_be0._M_dataplus._M_p,local_be0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba0._M_dataplus._M_p != &local_ba0.field_2) {
    operator_delete(local_ba0._M_dataplus._M_p,local_ba0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
    operator_delete(local_bc0._M_dataplus._M_p,local_bc0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a68);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_a88);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_b18 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  if ((this->super_LayoutBindingNegativeCase).m_tessSupport == true) {
    SVar1 = (this->super_LayoutBindingNegativeCase).m_shaderType;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    generateTessControlShader((string *)local_b40,SVar1,&local_be0,&local_bc0);
    local_b18._0_4_ = 3;
    local_b18._8_8_ = local_b08 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_b18 + 8),CONCAT44(local_b40._4_4_,local_b40._0_4_),
               (char *)(local_b40._8_8_ + CONCAT44(local_b40._4_4_,local_b40._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_900 + (ulong)(uint)local_b18._0_4_ * 0x18),(value_type *)(local_b18 + 8));
    SVar1 = (this->super_LayoutBindingNegativeCase).m_shaderType;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    generateTessEvaluationShader(&local_ba0,SVar1,&local_c00,&local_b80);
    local_c30._M_dataplus._M_p = (pointer)&local_c30.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c30,local_ba0._M_dataplus._M_p,
               local_ba0._M_dataplus._M_p + local_ba0._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_8a0,&local_c30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
      operator_delete(local_c30._M_dataplus._M_p,local_c30.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ba0._M_dataplus._M_p != &local_ba0.field_2) {
      operator_delete(local_ba0._M_dataplus._M_p,local_ba0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
      operator_delete(local_b80._M_dataplus._M_p,local_b80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c00._M_dataplus._M_p != &local_c00.field_2) {
      operator_delete(local_c00._M_dataplus._M_p,local_c00.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_b18._8_8_ != (pointer)(local_b08 + 8)) {
      operator_delete((void *)local_b18._8_8_,local_b08._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_b40._4_4_,local_b40._0_4_) != &local_b30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_b40._4_4_,local_b40._0_4_),
                      local_b30._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
      operator_delete(local_bc0._M_dataplus._M_p,local_bc0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_be0._M_dataplus._M_p != &local_be0.field_2) {
      operator_delete(local_be0._M_dataplus._M_p,local_be0.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram
            (this_00,((this->super_LayoutBindingNegativeCase).super_TestCase.m_context)->m_renderCtx
             ,(ProgramSources *)local_900);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_850);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_870);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_900 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  std::__cxx11::ostringstream::~ostringstream(local_788);
  std::ios_base::~ios_base(local_718);
  std::__cxx11::ostringstream::~ostringstream(local_610);
  std::ios_base::~ios_base(local_5a0);
  std::__cxx11::ostringstream::~ostringstream(local_498);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return this_00;
}

Assistant:

glu::ShaderProgram* SSBOBindingNegativeCase::generateShaders (void) const
{
	std::ostringstream		vertexUniformDecl;
	std::ostringstream		fragmentUniformDecl;
	std::ostringstream		tessCtrlUniformDecl;
	std::ostringstream		tessEvalUniformDecl;
	std::ostringstream		shaderBody;
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	const int				numDeclarations = (arrayInstance ? 1 : m_numBindings);

	// Generate the uniform declarations for the vertex and fragment shaders
	for (int declNdx = 0; declNdx < numDeclarations; ++declNdx)
	{
		vertexUniformDecl << "layout(std140, binding = " << m_vertexShaderBinding[declNdx] << ") buffer "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";

		fragmentUniformDecl << "layout(std140, binding = " << m_fragmentShaderBinding[declNdx] << ") buffer "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";

		tessCtrlUniformDecl << "layout(std140, binding = " << m_tessCtrlShaderBinding[declNdx] << ") buffer "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";

		tessEvalUniformDecl << "layout(std140, binding = " << m_tessEvalShaderBinding[declNdx] << ") buffer "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";
	}

	// Generate the shader body for the vertex and fragment shaders
	for (int bindNdx = 0; bindNdx < m_numBindings*2; ++bindNdx)	// Multiply by two to cover cases for both colors for each UBO
	{
		const std::string uname = (arrayInstance ? getUniformName("colors", 0, bindNdx/2) : getUniformName("colors", bindNdx/2));
		shaderBody	<< "	" << (bindNdx == 0 ? "if" : "else if") << " (u_arrayNdx == " << de::toString(bindNdx) << ")\n"
					<< "	{\n"
					<< "		color = " << uname << (bindNdx%2 == 0 ? ".color1" : ".color2") << ";\n"
					<< "	}\n";
	}

	shaderBody	<< "	else\n"
				<< "	{\n"
				<< "		color = vec4(0.0, 0.0, 0.0, 1.0);\n"
				<< "	}\n";

	glu::ProgramSources sources = glu::ProgramSources()
				<< glu::VertexSource(generateVertexShader(m_shaderType, vertexUniformDecl.str(), shaderBody.str()))
				<< glu::FragmentSource(generateFragmentShader(m_shaderType, fragmentUniformDecl.str(), shaderBody.str()));

	if (m_tessSupport)
		sources << glu::TessellationControlSource(generateTessControlShader(m_shaderType, tessCtrlUniformDecl.str(), shaderBody.str()))
				<< glu::TessellationEvaluationSource(generateTessEvaluationShader(m_shaderType, tessEvalUniformDecl.str(), shaderBody.str()));

	return new glu::ShaderProgram(m_context.getRenderContext(), sources);
}